

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void wallet::MaybeResendWalletTxs(WalletContext *context)

{
  element_type *peVar1;
  bool bVar2;
  time_point tVar3;
  shared_ptr<wallet::CWallet> *pwallet;
  pointer psVar4;
  long in_FS_OFFSET;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  GetWallets(&local_38,context);
  for (psVar4 = local_38.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar4 != local_38.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar4 = psVar4 + 1) {
    bVar2 = CWallet::ShouldResend
                      ((psVar4->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    if (bVar2) {
      CWallet::ResubmitWalletTransactions
                ((psVar4->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 true,false);
      peVar1 = (psVar4->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      tVar3 = CWallet::GetDefaultNextResend();
      (peVar1->m_next_resend).__d.__r = (rep)tVar3.__d.__r;
    }
  }
  std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  ::~vector(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MaybeResendWalletTxs(WalletContext& context)
{
    for (const std::shared_ptr<CWallet>& pwallet : GetWallets(context)) {
        if (!pwallet->ShouldResend()) continue;
        pwallet->ResubmitWalletTransactions(/*relay=*/true, /*force=*/false);
        pwallet->SetNextResend();
    }
}